

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O0

const_iterator
cmRemoveDuplicates<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
          (vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           *r)

{
  bool bVar1;
  size_type __n;
  bool local_109;
  value_type local_d0;
  const_iterator local_c8;
  ConfigFileInfo *local_c0;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  *local_b8;
  __normal_iterator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>_>
  local_b0;
  ConfigFileInfo *local_a8;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  local_a0;
  __normal_iterator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>_>
  local_98;
  __normal_iterator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>_>
  local_90;
  __normal_iterator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>_>
  local_88;
  iterator low;
  const_iterator local_78;
  const_iterator it;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  local_68;
  const_iterator end;
  size_t count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  undefined1 local_30 [8];
  vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  unique;
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  *r_local;
  
  unique.
  super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)r;
  std::
  vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  ::vector((vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
            *)local_30);
  __n = std::
        vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
        ::size((vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                *)unique.
                  super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  ::reserve((vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
             *)local_30,__n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  end._M_current = (ConfigFileInfo *)0x0;
  it._M_current =
       (ConfigFileInfo *)
       std::
       vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
       ::end((vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
              *)unique.
                super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::
  __normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
  ::__normal_iterator<cmFindPackageCommand::ConfigFileInfo*>
            ((__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
              *)&local_68,
             (__normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
              *)&it);
  low._M_current =
       (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
        *)std::
          vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
          ::begin((vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                   *)unique.
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::
  __normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
  ::__normal_iterator<cmFindPackageCommand::ConfigFileInfo*>
            ((__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
              *)&local_78,
             (__normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
              *)&low);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_78,&local_68);
    if (!bVar1) break;
    local_90._M_current =
         (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
          *)std::
            vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
            ::begin((vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                     *)local_30);
    local_98._M_current =
         (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
          *)std::
            vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
            ::end((vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                   *)local_30);
    local_a8 = local_78._M_current;
    local_a0._M_current =
         (ConfigFileInfo *)
         ContainerAlgorithms::
         RemoveDuplicatesAPI<std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>,_cmFindPackageCommand::ConfigFileInfo>
         ::uniqueValue(local_78);
    local_88 = std::
               lower_bound<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>*,std::vector<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>>>,__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,bool(*)(__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>)>
                         (local_90,local_98,&local_a0,
                          ContainerAlgorithms::
                          RemoveDuplicatesAPI<std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>,_cmFindPackageCommand::ConfigFileInfo>
                          ::lessThan);
    local_b0._M_current =
         (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
          *)std::
            vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
            ::end((vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                   *)local_30);
    bVar1 = __gnu_cxx::operator==(&local_88,&local_b0);
    local_109 = true;
    if (!bVar1) {
      local_b8 = local_88._M_current;
      local_c0 = local_78._M_current;
      local_109 = ContainerAlgorithms::
                  RemoveDuplicatesAPI<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>,cmFindPackageCommand::ConfigFileInfo>
                  ::
                  valueCompare<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>*,std::vector<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>>>>
                            (local_88,local_78);
    }
    if (local_109 == false) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count,
                 (value_type_conflict1 *)&end);
    }
    else {
      __gnu_cxx::
      __normal_iterator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>const*,std::vector<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>>>
      ::
      __normal_iterator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>*>
                ((__normal_iterator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>const*,std::vector<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>>>
                  *)&local_c8,&local_88);
      local_d0._M_current =
           (ConfigFileInfo *)
           ContainerAlgorithms::
           RemoveDuplicatesAPI<std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>,_cmFindPackageCommand::ConfigFileInfo>
           ::uniqueValue(local_78);
      std::
      vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
      ::insert((vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                *)local_30,local_c8,&local_d0);
    }
    __gnu_cxx::
    __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
    ::operator++(&local_78);
    end._M_current = (ConfigFileInfo *)&((end._M_current)->filename).field_0x1;
  }
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  if (bVar1) {
    r_local = (vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
               *)local_68._M_current;
  }
  else {
    r_local = (vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
               *)cmRemoveIndices<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                           ((vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                             *)unique.
                               super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  std::
  vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  ::~vector((vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
             *)local_30);
  return (const_iterator)(ConfigFileInfo *)r_local;
}

Assistant:

typename Range::const_iterator cmRemoveDuplicates(Range& r)
{
  typedef typename ContainerAlgorithms::RemoveDuplicatesAPI<Range> API;
  typedef typename API::value_type T;
  std::vector<T> unique;
  unique.reserve(r.size());
  std::vector<size_t> indices;
  size_t count = 0;
  const typename Range::const_iterator end = r.end();
  for (typename Range::const_iterator it = r.begin(); it != end;
       ++it, ++count) {
    const typename std::vector<T>::iterator low = std::lower_bound(
      unique.begin(), unique.end(), API::uniqueValue(it), API::lessThan);
    if (low == unique.end() || API::valueCompare(low, it)) {
      unique.insert(low, API::uniqueValue(it));
    } else {
      indices.push_back(count);
    }
  }
  if (indices.empty()) {
    return end;
  }
  return cmRemoveIndices(r, indices);
}